

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O0

Color32 __thiscall nv::ColorBlock::averageColor(ColorBlock *this)

{
  long in_RSI;
  undefined4 local_2c;
  undefined4 local_28;
  uint i;
  uint a;
  uint b;
  uint g;
  uint r;
  ColorBlock *this_local;
  
  local_28 = 0;
  i = 0;
  a = 0;
  b = 0;
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
    b = *(byte *)(in_RSI + 2 + (ulong)local_2c * 4) + b;
    a = *(byte *)(in_RSI + 1 + (ulong)local_2c * 4) + a;
    i = *(byte *)(in_RSI + (ulong)local_2c * 4) + i;
    local_28 = *(byte *)(in_RSI + 3 + (ulong)local_2c * 4) + local_28;
  }
  Color32::Color32(this->m_color,(uint8)(b >> 4),(uint8)(a >> 4),(uint8)(i >> 4),
                   (uint8)(local_28 >> 4));
  return (Color32)SUB84(this,0);
}

Assistant:

Color32 ColorBlock::averageColor() const
{
	uint r, g, b, a;
	r = g = b = a = 0;

	for(uint i = 0; i < 16; i++) {
		r += m_color[i].r;
		g += m_color[i].g;
		b += m_color[i].b;
		a += m_color[i].a;
	}
	
	return Color32(uint8(r / 16), uint8(g / 16), uint8(b / 16), uint8(a / 16));
}